

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  size_t __n;
  uint uVar1;
  ushort uVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  undefined8 uVar3;
  string *__n_00;
  size_t sVar4;
  DescriptorProto *pDVar5;
  undefined1 uVar6;
  bool bVar7;
  string sVar8;
  ushort uVar9;
  int iVar10;
  Rep *pRVar11;
  size_t *psVar12;
  uint64_t uVar13;
  size_t sVar14;
  string *psVar15;
  ulong uVar16;
  CommonFields *pCVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  long lVar20;
  DescriptorProto *pDVar21;
  DescriptorProto *pDVar22;
  undefined3 in_register_00000089;
  undefined4 uVar23;
  undefined4 in_register_0000008c;
  uint uVar24;
  ulong uVar25;
  uint64_t v;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar26;
  long *plVar27;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  FindInfo target;
  string_view input;
  anon_class_24_3_4f82d86e make_error;
  JsonNameDetails details;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  __m128i match;
  undefined1 local_190 [32];
  DescriptorProto *local_170;
  DescriptorProto *local_168;
  string *local_160;
  undefined1 local_158 [64];
  CommonFields local_118 [4];
  undefined8 local_90;
  undefined8 local_88;
  string local_80 [16];
  undefined1 local_70 [16];
  VoidPtr local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  VoidPtr local_40;
  code *pcStack_38;
  
  uVar23 = CONCAT31(in_register_00000089,use_custom_names);
  local_118[1].heap_or_soo_._8_8_ = message_name._M_str;
  local_118[1].heap_or_soo_._0_8_ = message_name._M_len;
  local_118[0].capacity_ = 0;
  local_118[0].size_ = 0;
  local_118[2].capacity_ = (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_118[0].heap_or_soo_.heap.control =
       absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  pRVar28 = &(message->field_0)._impl_.field_;
  pDVar21 = message;
  pRVar26 = pRVar28;
  local_158._60_4_ = uVar23;
  local_118[1].size_ = (size_t)this;
  local_90 = descriptor;
  if ((undefined1  [224])((undefined1  [224])message->field_0 & (undefined1  [224])0x1) !=
      (undefined1  [224])0x0) {
    pRVar11 = internal::RepeatedPtrFieldBase::rep(&pRVar28->super_RepeatedPtrFieldBase);
    pRVar26 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar11->elements;
    if (((ulong)(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar11 = internal::RepeatedPtrFieldBase::rep(&pRVar28->super_RepeatedPtrFieldBase);
      pRVar28 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar11->elements;
    }
  }
  local_88 = &(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
             *(int *)((long)&message->field_0 + 0x10);
  if (pRVar26 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_88) {
LAB_00220317:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                     *)(local_158 + 0x40));
    return;
  }
LAB_0021fa5a:
  uVar18 = (pRVar26->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
  psVar12 = (size_t *)
            ((ulong)(((DescriptorProto *)uVar18)->field_0)._impl_.field_.super_RepeatedPtrFieldBase.
                    tagged_rep_or_elem_ & 0xfffffffffffffffc);
  input._M_str = (char *)pDVar21;
  input._M_len = *psVar12;
  local_158._40_8_ = pRVar26;
  protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
            ((string *)local_190,(_anonymous_namespace_ *)psVar12[1],input);
  if ((local_158[0x3c] == '\0') ||
     ((undefined1  [224])
      ((undefined1  [224])((DescriptorProto *)uVar18)->field_0 & (undefined1  [224])0x10) ==
      (undefined1  [224])0x0)) {
LAB_0021fa92:
    if ((DescriptorProto *)local_190._0_8_ == (DescriptorProto *)(local_190 + 0x10)) {
      local_158._8_8_ = local_190._24_8_;
      local_168 = (DescriptorProto *)local_158;
    }
    else {
      local_168 = (DescriptorProto *)local_190._0_8_;
    }
    local_158._0_8_ = local_190._16_8_;
    local_160 = (string *)local_190._8_8_;
    local_158[0x10] = 0;
    local_170 = (DescriptorProto *)uVar18;
LAB_0021fad4:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                *)local_118[0].capacity_);
    psVar15 = local_160;
    uVar13 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,local_168,
                        local_160);
    uVar3 = local_118[0].heap_or_soo_.heap.slot_array;
    __n_00 = local_160;
    sVar14 = local_118[0].capacity_;
    local_158._24_8_ = uVar18;
    if (((ulong)(local_118[0].capacity_ + 1) & local_118[0].capacity_) == 0) {
      uVar16 = (uVar13 ^ (ulong)psVar15) * -0x234dd359734ecb13;
      pCVar17 = (CommonFields *)
                (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      uVar25 = (ulong)pCVar17 >> 7 ^ (ulong)local_118[0].heap_or_soo_._0_8_ >> 0xc;
      uVar6 = (undefined1)(uVar16 >> 0x38);
      auVar29 = ZEXT216(CONCAT11(uVar6,uVar6) & 0x7f7f);
      auVar29 = pshuflw(auVar29,auVar29,0);
      local_118[3].capacity_._0_4_ = auVar29._0_4_;
      local_118[3].capacity_._4_4_ = (undefined4)local_118[3].capacity_;
      local_118[3].size_._0_4_ = (undefined4)local_118[3].capacity_;
      local_118[3].size_._4_4_ = (undefined4)local_118[3].capacity_;
      local_118[2].size_ = (size_t)local_168;
      local_158._32_8_ = (DescriptorProto *)0x0;
      local_158._48_8_ = local_118[0].heap_or_soo_.heap.control;
      local_118[3].heap_or_soo_._0_8_ = pCVar17;
      do {
        uVar25 = uVar25 & sVar14;
        psVar15 = (string *)(local_158._48_8_ + uVar25);
        local_118[2].heap_or_soo_._8_1_ = psVar15[8];
        local_118[2].heap_or_soo_._9_1_ = psVar15[9];
        local_118[2].heap_or_soo_._10_1_ = psVar15[10];
        local_118[2].heap_or_soo_._11_1_ = psVar15[0xb];
        local_118[2].heap_or_soo_._12_1_ = psVar15[0xc];
        local_118[2].heap_or_soo_._13_1_ = psVar15[0xd];
        local_118[2].heap_or_soo_._14_1_ = psVar15[0xe];
        local_118[2].heap_or_soo_._15_1_ = psVar15[0xf];
        auVar29[0] = -(local_118[3].capacity_._0_1_ == *psVar15);
        auVar29[1] = -(local_118[3].capacity_._1_1_ == psVar15[1]);
        auVar29[2] = -(local_118[3].capacity_._2_1_ == psVar15[2]);
        auVar29[3] = -(local_118[3].capacity_._3_1_ == psVar15[3]);
        auVar29[4] = -(local_118[3].capacity_._4_1_ == psVar15[4]);
        auVar29[5] = -(local_118[3].capacity_._5_1_ == psVar15[5]);
        auVar29[6] = -(local_118[3].capacity_._6_1_ == psVar15[6]);
        auVar29[7] = -(local_118[3].capacity_._7_1_ == psVar15[7]);
        auVar29[8] = -(local_118[3].size_._0_1_ == (string)local_118[2].heap_or_soo_._8_1_);
        auVar29[9] = -(local_118[3].size_._1_1_ == (string)local_118[2].heap_or_soo_._9_1_);
        auVar29[10] = -(local_118[3].size_._2_1_ == (string)local_118[2].heap_or_soo_._10_1_);
        auVar29[0xb] = -(local_118[3].size_._3_1_ == (string)local_118[2].heap_or_soo_._11_1_);
        auVar29[0xc] = -(local_118[3].size_._4_1_ == (string)local_118[2].heap_or_soo_._12_1_);
        auVar29[0xd] = -(local_118[3].size_._5_1_ == (string)local_118[2].heap_or_soo_._13_1_);
        auVar29[0xe] = -(local_118[3].size_._6_1_ == (string)local_118[2].heap_or_soo_._14_1_);
        auVar29[0xf] = -(local_118[3].size_._7_1_ == (string)local_118[2].heap_or_soo_._15_1_);
        uVar9 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
        uVar24 = (uint)uVar9;
        uVar18 = local_118[3].heap_or_soo_._0_8_;
        uVar19 = *(DescriptorProto **)psVar15;
        while (local_118[2].heap_or_soo_._0_8_ = uVar19, local_118[3].heap_or_soo_._0_8_ = uVar18,
              uVar9 != 0) {
          uVar1 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
            }
          }
          uVar16 = uVar1 + uVar25 & sVar14;
          lVar20 = uVar16 * 0x50;
          if ((*(string **)((string *)(uVar3 + 8) + lVar20) == __n_00) &&
             ((__n_00 == (string *)0x0 ||
              (iVar10 = bcmp(*(void **)(uVar3 + lVar20),(void *)local_118[2].size_,(size_t)__n_00),
              iVar10 == 0)))) {
            if ((DescriptorProto *)local_158._48_8_ == (DescriptorProto *)0x0) goto LAB_002203b5;
            pDVar21 = (DescriptorProto *)(local_158._48_8_ + uVar16);
            if (pDVar21 == (DescriptorProto *)local_118[2].capacity_) goto LAB_0022033b;
            if (*(char *)&(pDVar21->super_Message).super_MessageLite._vptr_MessageLite < '\0')
            goto LAB_00220366;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
            ::iterator::operator*((iterator *)pDVar21);
            pRVar28 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_158._40_8_;
            psVar15 = (string *)(uVar3 + lVar20);
            uVar18 = CONCAT71((int7)((ulong)pCVar17 >> 8),local_158[0x10]);
            if (local_158[0x3c] == '\0') {
              if ((local_158[0x10] & 1) == 0) goto LAB_00220177;
LAB_00220154:
              sVar8 = psVar15[0x48];
            }
            else {
              if ((local_158[0x10] & 1) != 0) goto LAB_00220154;
              if (psVar15[0x48] != (string)0x1) goto LAB_0022025c;
LAB_00220177:
              sVar8 = (string)0x0;
            }
            local_190._0_8_ = &local_170;
            local_190._16_8_ = local_158._24_8_;
            uVar18 = local_158._24_8_;
            local_190._8_8_ = psVar15 + 0x20;
            if ((((*(FeatureSet **)(local_90 + 0x38))->field_0)._impl_.json_format_ == 2) &&
               (sVar8 == (string)0x0)) {
              pcStack_48 = absl::lts_20250127::functional_internal::
                           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              local_50.obj = local_190;
              element_name._M_str = (char *)local_118[1].heap_or_soo_._8_8_;
              element_name._M_len = local_118[1].heap_or_soo_._0_8_;
              make_error_00.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              make_error_00.ptr_.obj = local_50.obj;
              AddWarning((DescriptorBuilder *)local_118[1].size_,element_name,
                         (Message *)local_158._24_8_,NAME,make_error_00);
            }
            else {
              pcStack_58 = absl::lts_20250127::functional_internal::
                           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              local_60.obj = local_190;
              element_name_00._M_str = (char *)local_118[1].heap_or_soo_._8_8_;
              element_name_00._M_len = local_118[1].heap_or_soo_._0_8_;
              make_error_01.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              make_error_01.ptr_.obj = local_60.obj;
              AddError((DescriptorBuilder *)local_118[1].size_,element_name_00,
                       (Message *)local_158._24_8_,NAME,make_error_01);
            }
            goto LAB_0022025c;
          }
          uVar9 = (ushort)(uVar24 - 1) & (ushort)uVar24;
          uVar24 = CONCAT22((short)(uVar24 - 1 >> 0x10),uVar9);
          uVar18 = local_118[3].heap_or_soo_._0_8_;
          uVar19 = local_118[2].heap_or_soo_._0_8_;
        }
        local_118[2].heap_or_soo_._0_1_ = (undefined1)uVar19;
        local_118[2].heap_or_soo_._1_1_ = (undefined1)((ulong)uVar19 >> 8);
        local_118[2].heap_or_soo_._2_1_ = (undefined1)((ulong)uVar19 >> 0x10);
        local_118[2].heap_or_soo_._3_1_ = (undefined1)((ulong)uVar19 >> 0x18);
        local_118[2].heap_or_soo_._4_1_ = (undefined1)((ulong)uVar19 >> 0x20);
        local_118[2].heap_or_soo_._5_1_ = (undefined1)((ulong)uVar19 >> 0x28);
        local_118[2].heap_or_soo_._6_1_ = (undefined1)((ulong)uVar19 >> 0x30);
        local_118[2].heap_or_soo_._7_1_ = (undefined1)((ulong)uVar19 >> 0x38);
        auVar30[0] = -(local_118[2].heap_or_soo_._0_1_ == -0x80);
        auVar30[1] = -(local_118[2].heap_or_soo_._1_1_ == -0x80);
        auVar30[2] = -(local_118[2].heap_or_soo_._2_1_ == -0x80);
        auVar30[3] = -(local_118[2].heap_or_soo_._3_1_ == -0x80);
        auVar30[4] = -(local_118[2].heap_or_soo_._4_1_ == -0x80);
        auVar30[5] = -(local_118[2].heap_or_soo_._5_1_ == -0x80);
        auVar30[6] = -(local_118[2].heap_or_soo_._6_1_ == -0x80);
        auVar30[7] = -(local_118[2].heap_or_soo_._7_1_ == -0x80);
        auVar30[8] = -((string)local_118[2].heap_or_soo_._8_1_ == (string)0x80);
        auVar30[9] = -((string)local_118[2].heap_or_soo_._9_1_ == (string)0x80);
        auVar30[10] = -((string)local_118[2].heap_or_soo_._10_1_ == (string)0x80);
        auVar30[0xb] = -((string)local_118[2].heap_or_soo_._11_1_ == (string)0x80);
        auVar30[0xc] = -((string)local_118[2].heap_or_soo_._12_1_ == (string)0x80);
        auVar30[0xd] = -((string)local_118[2].heap_or_soo_._13_1_ == (string)0x80);
        auVar30[0xe] = -((string)local_118[2].heap_or_soo_._14_1_ == (string)0x80);
        auVar30[0xf] = -((string)local_118[2].heap_or_soo_._15_1_ == (string)0x80);
        uVar9 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
        if (uVar9 != 0) goto LAB_0021fc67;
        uVar25 = (long)&((DescriptorProto *)local_158._32_8_)->field_0 + uVar25;
        pCVar17 = (CommonFields *)&((DescriptorProto *)local_158._32_8_)->field_0;
        local_158._32_8_ = pCVar17;
      } while (pCVar17 <= sVar14);
      goto LAB_00220442;
    }
    goto LAB_00220396;
  }
  uVar16._0_4_ = *(int *)((long)&((DescriptorProto *)uVar18)->field_0 + 0x28);
  uVar16._4_4_ = *(int *)((long)&((DescriptorProto *)uVar18)->field_0 + 0x2c);
  plVar27 = (long *)(uVar16 & 0xfffffffffffffffc);
  psVar15 = (string *)plVar27[1];
  if ((psVar15 == (string *)local_190._8_8_) &&
     ((psVar15 == (string *)0x0 ||
      (iVar10 = bcmp((void *)*plVar27,(void *)local_190._0_8_,(size_t)psVar15), iVar10 == 0))))
  goto LAB_0021fa92;
  local_170 = (DescriptorProto *)uVar18;
  local_168 = (DescriptorProto *)local_158;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,*plVar27,psVar15 + *plVar27);
  local_158[0x10] = 1;
  if (((DescriptorProto *)local_190._0_8_ != (DescriptorProto *)(local_190 + 0x10)) &&
     (operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1)),
     (local_158[0x10] & 1) == 0)) goto LAB_0021fad4;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char*>(local_80,local_168,local_160 + (long)local_168);
  if (((MessageOptions *)local_80._8_8_ == (MessageOptions *)0x0) ||
     (*(char *)local_80._0_8_ != '[')) {
    bVar7 = false;
  }
  else {
    bVar7 = ((char *)(local_80._0_8_ + -1))[local_80._8_8_] == ']';
  }
  if ((undefined1 *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70._0_8_ + 1);
  }
  if (!bVar7) goto LAB_0021fad4;
  local_190._8_8_ = &local_170;
  pcStack_38 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
  ;
  local_40.obj = local_190;
  element_name_01._M_str = (char *)local_118[1].heap_or_soo_._8_8_;
  element_name_01._M_len = local_118[1].heap_or_soo_._0_8_;
  make_error_02.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
  ;
  make_error_02.ptr_.obj = local_40.obj;
  local_190._0_8_ = uVar18;
  AddError((DescriptorBuilder *)local_118[1].size_,element_name_01,(Message *)uVar18,NAME,
           make_error_02);
  pRVar28 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_158._40_8_;
  goto LAB_0022025c;
LAB_0021fc67:
  bVar7 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                    (sVar14,uVar18,(ctrl_t *)local_158._48_8_);
  if (bVar7) {
    uVar2 = 0xf;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar24 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
  }
  else {
    uVar24 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
      }
    }
  }
  target.probe_length =
       (size_t)absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
               ::GetPolicyFunctions()::value;
  target.offset = local_158._32_8_;
  sVar14 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                     ((container_internal *)(local_158 + 0x40),(CommonFields *)uVar18,
                      uVar24 + uVar25 & sVar14,target,
                      (PolicyFunctions *)CONCAT44(in_register_0000008c,uVar23));
  uVar3 = local_118[0].heap_or_soo_.heap.control;
  if ((DescriptorProto *)local_118[0].heap_or_soo_._0_8_ == (DescriptorProto *)0x0) {
LAB_002203b5:
    __assert_fail("ctrl != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x9ef,
                  "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                 );
  }
  sVar4 = local_118[0].capacity_;
  pDVar21 = (DescriptorProto *)(local_118[0].heap_or_soo_.heap.slot_array + sVar14 * 0x50);
  local_118[0].capacity_ = 0xffffffffffffff9c;
  psVar15 = (string *)(local_118[0].heap_or_soo_.heap.slot_array + sVar14 * 0x50);
  *(string **)psVar15 = psVar15 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)pDVar21,local_168,local_160 + (long)local_168)
  ;
  *(DescriptorProto **)&(pDVar21->field_0)._impl_.field_.super_RepeatedPtrFieldBase.current_size_ =
       local_170;
  (pDVar21->field_0)._impl_.field_.super_RepeatedPtrFieldBase.arena_ =
       (Arena *)((long)&pDVar21->field_0 + 0x28);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&pDVar21->field_0 + 0x18),local_168,local_160 + (long)local_168);
  *(undefined1 *)((long)&pDVar21->field_0 + 0x38) = local_158[0x10];
  absl::lts_20250127::container_internal::CommonFields::set_capacity
            ((CommonFields *)(local_158 + 0x40),sVar4);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::iterator::operator*((iterator *)(uVar3 + sVar14));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
              *)local_118[0].capacity_);
  uVar16 = (pDVar21->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar13 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                     (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                      (pDVar21->super_Message).super_MessageLite._vptr_MessageLite,uVar16);
  uVar19 = local_118[0].heap_or_soo_.heap.slot_array;
  sVar4 = local_118[0].capacity_;
  if (((ulong)(local_118[0].capacity_ + 1) & local_118[0].capacity_) == 0) {
    uVar16 = (uVar13 ^ uVar16) * -0x234dd359734ecb13;
    uVar18 = (ulong)local_118[0].heap_or_soo_._0_8_ >> 0xc;
    uVar25 = (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
              (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
              (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38) >> 7 ^ uVar18;
    uVar6 = (undefined1)(uVar16 >> 0x38);
    auVar29 = ZEXT216(CONCAT11(uVar6,uVar6) & 0x7f7f);
    auVar29 = pshuflw(auVar29,auVar29,0);
    local_118[3].capacity_._0_4_ = auVar29._0_4_;
    local_118[3].capacity_._4_4_ = (undefined4)local_118[3].capacity_;
    local_118[3].size_._0_4_ = (undefined4)local_118[3].capacity_;
    local_118[3].size_._4_4_ = (undefined4)local_118[3].capacity_;
    local_118[2].size_ = (size_t)(pDVar21->super_Message).super_MessageLite._vptr_MessageLite;
    __n = (pDVar21->super_Message).super_MessageLite._internal_metadata_.ptr_;
    uVar16 = 0;
    local_158._24_8_ = local_118[0].heap_or_soo_.heap.control;
    local_158._32_8_ = pDVar21;
    local_118[2].heap_or_soo_._0_8_ = (DescriptorProto *)(uVar3 + sVar14);
    while( true ) {
      pDVar21 = (DescriptorProto *)(uVar25 & sVar4);
      psVar15 = (string *)(local_158._24_8_ + (long)pDVar21);
      local_118[3].heap_or_soo_._8_1_ = psVar15[8];
      local_118[3].heap_or_soo_._9_1_ = psVar15[9];
      local_118[3].heap_or_soo_._10_1_ = psVar15[10];
      local_118[3].heap_or_soo_._11_1_ = psVar15[0xb];
      local_118[3].heap_or_soo_._12_1_ = psVar15[0xc];
      local_118[3].heap_or_soo_._13_1_ = psVar15[0xd];
      local_118[3].heap_or_soo_._14_1_ = psVar15[0xe];
      local_118[3].heap_or_soo_._15_1_ = psVar15[0xf];
      auVar31[0] = -(local_118[3].capacity_._0_1_ == *psVar15);
      auVar31[1] = -(local_118[3].capacity_._1_1_ == psVar15[1]);
      auVar31[2] = -(local_118[3].capacity_._2_1_ == psVar15[2]);
      auVar31[3] = -(local_118[3].capacity_._3_1_ == psVar15[3]);
      auVar31[4] = -(local_118[3].capacity_._4_1_ == psVar15[4]);
      auVar31[5] = -(local_118[3].capacity_._5_1_ == psVar15[5]);
      auVar31[6] = -(local_118[3].capacity_._6_1_ == psVar15[6]);
      auVar31[7] = -(local_118[3].capacity_._7_1_ == psVar15[7]);
      auVar31[8] = -(local_118[3].size_._0_1_ == (string)local_118[3].heap_or_soo_._8_1_);
      auVar31[9] = -(local_118[3].size_._1_1_ == (string)local_118[3].heap_or_soo_._9_1_);
      auVar31[10] = -(local_118[3].size_._2_1_ == (string)local_118[3].heap_or_soo_._10_1_);
      auVar31[0xb] = -(local_118[3].size_._3_1_ == (string)local_118[3].heap_or_soo_._11_1_);
      auVar31[0xc] = -(local_118[3].size_._4_1_ == (string)local_118[3].heap_or_soo_._12_1_);
      auVar31[0xd] = -(local_118[3].size_._5_1_ == (string)local_118[3].heap_or_soo_._13_1_);
      auVar31[0xe] = -(local_118[3].size_._6_1_ == (string)local_118[3].heap_or_soo_._14_1_);
      auVar31[0xf] = -(local_118[3].size_._7_1_ == (string)local_118[3].heap_or_soo_._15_1_);
      uVar9 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
      uVar24 = (uint)uVar9;
      pDVar5 = pDVar21;
      pDVar22 = (DescriptorProto *)local_158._48_8_;
      uVar3 = *(CommonFields **)psVar15;
      while (local_158._48_8_ = pDVar5, local_118[3].heap_or_soo_._0_8_ = uVar3, uVar9 != 0) {
        uVar1 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar25 = (ulong)((long)&(pDVar21->super_Message).super_MessageLite._vptr_MessageLite +
                        (ulong)uVar1) & sVar4;
        lVar20 = uVar25 * 0x50;
        if ((*(size_t *)((string *)(uVar19 + 8) + lVar20) == __n) &&
           ((__n == 0 ||
            (iVar10 = bcmp(*(void **)(uVar19 + lVar20),(void *)local_118[2].size_,__n),
            pDVar21 = (DescriptorProto *)local_158._48_8_, iVar10 == 0)))) {
          if ((DescriptorProto *)local_158._24_8_ == (DescriptorProto *)0x0) goto LAB_002203b5;
          pDVar21 = (DescriptorProto *)(local_158._24_8_ + uVar25);
          if (pDVar21 != (DescriptorProto *)local_118[2].capacity_) {
            if (*(char *)&(pDVar21->super_Message).super_MessageLite._vptr_MessageLite < '\0')
            goto LAB_00220391;
            uVar19 = uVar19 + lVar20;
            bVar7 = false;
            goto LAB_002200bb;
          }
          pDVar21 = (DescriptorProto *)local_118[2].capacity_;
          if (local_118[2].heap_or_soo_._0_8_ == local_118[2].capacity_) goto LAB_00220253;
          if (-1 < (char)*(string *)local_118[2].heap_or_soo_._0_8_) goto LAB_002203f8;
          goto LAB_0022043d;
        }
        uVar9 = (ushort)(uVar24 - 1) & (ushort)uVar24;
        uVar24 = CONCAT22((short)(uVar24 - 1 >> 0x10),uVar9);
        pDVar5 = (DescriptorProto *)local_158._48_8_;
        pDVar22 = (DescriptorProto *)local_158._48_8_;
        uVar3 = local_118[3].heap_or_soo_._0_8_;
      }
      local_118[3].heap_or_soo_._0_1_ = (undefined1)uVar3;
      local_118[3].heap_or_soo_._1_1_ = (undefined1)((ulong)uVar3 >> 8);
      local_118[3].heap_or_soo_._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
      local_118[3].heap_or_soo_._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
      local_118[3].heap_or_soo_._4_1_ = (undefined1)((ulong)uVar3 >> 0x20);
      local_118[3].heap_or_soo_._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
      local_118[3].heap_or_soo_._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
      local_118[3].heap_or_soo_._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
      auVar32[0] = -(local_118[3].heap_or_soo_._0_1_ == -0x80);
      auVar32[1] = -(local_118[3].heap_or_soo_._1_1_ == -0x80);
      auVar32[2] = -(local_118[3].heap_or_soo_._2_1_ == -0x80);
      auVar32[3] = -(local_118[3].heap_or_soo_._3_1_ == -0x80);
      auVar32[4] = -(local_118[3].heap_or_soo_._4_1_ == -0x80);
      auVar32[5] = -(local_118[3].heap_or_soo_._5_1_ == -0x80);
      auVar32[6] = -(local_118[3].heap_or_soo_._6_1_ == -0x80);
      auVar32[7] = -(local_118[3].heap_or_soo_._7_1_ == -0x80);
      auVar32[8] = -((string)local_118[3].heap_or_soo_._8_1_ == (string)0x80);
      auVar32[9] = -((string)local_118[3].heap_or_soo_._9_1_ == (string)0x80);
      auVar32[10] = -((string)local_118[3].heap_or_soo_._10_1_ == (string)0x80);
      auVar32[0xb] = -((string)local_118[3].heap_or_soo_._11_1_ == (string)0x80);
      auVar32[0xc] = -((string)local_118[3].heap_or_soo_._12_1_ == (string)0x80);
      auVar32[0xd] = -((string)local_118[3].heap_or_soo_._13_1_ == (string)0x80);
      auVar32[0xe] = -((string)local_118[3].heap_or_soo_._14_1_ == (string)0x80);
      auVar32[0xf] = -((string)local_118[3].heap_or_soo_._15_1_ == (string)0x80);
      local_158._48_8_ = pDVar22;
      if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (string)local_118[3].heap_or_soo_._15_1_ == (string)0x80) break;
      uVar25 = uVar16 + (long)&pDVar21->field_0;
      uVar16 = uVar16 + 0x10;
      if (sVar4 < uVar16) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                     );
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                *)sVar4);
    bVar7 = true;
    pDVar21 = (DescriptorProto *)0x0;
LAB_002200bb:
    if (local_118[2].heap_or_soo_._0_8_ == local_118[2].capacity_) {
LAB_002203f8:
      absl::lts_20250127::raw_log_internal::RawLog
                (kFatal,"raw_hash_set.h",0x6bf,"Invalid iterator comparison. %s",
                 "Comparing default-constructed hashtable iterator with a non-default-constructed hashtable iterator."
                );
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x6bf,
                    "auto absl::container_internal::AssertSameContainer(const ctrl_t *, const ctrl_t *, const void *const &, const void *const &, const GenerationType *, const GenerationType *)::(anonymous class)::operator()(bool, const char *) const"
                   );
    }
    if ((char)*(string *)local_118[2].heap_or_soo_._0_8_ < '\0') {
LAB_0022043d:
      CheckFieldJsonNameUniqueness();
LAB_00220442:
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                   );
    }
    if (bVar7) goto LAB_00220253;
    bVar7 = ((undefined1 *)local_118[2].heap_or_soo_._0_8_ ==
            absl::lts_20250127::container_internal::kSooControl) !=
            (pDVar21 == (DescriptorProto *)absl::lts_20250127::container_internal::kSooControl);
    uVar18 = CONCAT71(0x49d7,bVar7);
    if (!bVar7) {
      if (pDVar21 == (DescriptorProto *)absl::lts_20250127::container_internal::kSooControl) {
        pDVar21 = (DescriptorProto *)absl::lts_20250127::container_internal::kSooControl;
        if (uVar19 == local_158._32_8_) goto LAB_00220253;
      }
      else {
        pDVar22 = (DescriptorProto *)local_158._32_8_;
        uVar18 = local_118[2].heap_or_soo_._0_8_;
        if ((ulong)local_118[2].heap_or_soo_._0_8_ < pDVar21) {
          pDVar22 = (DescriptorProto *)uVar19;
          uVar18 = pDVar21;
          uVar19 = local_158._32_8_;
        }
        if (((ulong)uVar18 < (ulong)uVar19) && ((ulong)uVar19 <= pDVar22)) {
LAB_00220253:
          pRVar28 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_158._40_8_;
          if (pDVar21 != (DescriptorProto *)local_118[2].heap_or_soo_._0_8_) {
            __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xfe2,
                          "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                         );
          }
LAB_0022025c:
          if (local_168 != (DescriptorProto *)local_158) {
            operator_delete(local_168,
                            (ulong)((long)&(((Message *)local_158._0_8_)->super_MessageLite).
                                           _vptr_MessageLite + 1));
          }
          pRVar26 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                    &(pRVar28->super_RepeatedPtrFieldBase).current_size_;
          pDVar21 = (DescriptorProto *)uVar18;
          if (pRVar26 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_88)
          goto LAB_00220317;
          goto LAB_0021fa5a;
        }
      }
    }
    CheckFieldJsonNameUniqueness();
LAB_0022033b:
    absl::lts_20250127::raw_log_internal::RawLog
              (kFatal,"raw_hash_set.h",0x660,"%s called on default-constructed iterator.",
               "operator->");
    CheckFieldJsonNameUniqueness();
LAB_00220366:
    absl::lts_20250127::raw_log_internal::RawLog
              (kFatal,"raw_hash_set.h",0x676,
               "%s called on invalid iterator. The element might have been erased or the table might have rehashed. Consider running with --config=asan to diagnose rehashing issues."
               ,"operator->");
    CheckFieldJsonNameUniqueness();
LAB_00220391:
    CheckFieldJsonNameUniqueness();
  }
LAB_00220396:
  __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x14c,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}